

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O2

int runCommand(char *command,UBool specialHandling)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = strlen(command);
  if ((int)sVar2 == 0) {
    uVar3 = 0;
  }
  else {
    printf("pkgdata: %s\n",command);
    uVar1 = system(command);
    uVar3 = 0;
    if (uVar1 != 0) {
      fprintf(_stderr,"-- return status = %d\n",(ulong)uVar1);
      uVar3 = uVar1;
    }
  }
  return uVar3;
}

Assistant:

static int runCommand(const char* command, UBool specialHandling) {
    char *cmd = NULL;
    char cmdBuffer[SMALL_BUFFER_MAX_SIZE];
    int32_t len = static_cast<int32_t>(strlen(command));

    if (len == 0) {
        return 0;
    }

    if (!specialHandling) {
#if defined(USING_CYGWIN) || U_PLATFORM == U_PF_MINGW || U_PLATFORM == U_PF_OS400
        if ((len + BUFFER_PADDING_SIZE) >= SMALL_BUFFER_MAX_SIZE) {
            cmd = (char *)uprv_malloc(len + BUFFER_PADDING_SIZE);
        } else {
            cmd = cmdBuffer;
        }
#if defined(USING_CYGWIN) || U_PLATFORM == U_PF_MINGW
        sprintf(cmd, "bash -c \"%s\"", command);

#elif U_PLATFORM == U_PF_OS400
        sprintf(cmd, "QSH CMD('%s')", command);
#endif
#else
        goto normal_command_mode;
#endif
    } else {
#if !(defined(USING_CYGWIN) || U_PLATFORM == U_PF_MINGW || U_PLATFORM == U_PF_OS400)
normal_command_mode:
#endif
        cmd = (char *)command;
    }

    printf("pkgdata: %s\n", cmd);
    int result = system(cmd);
    if (result != 0) {
        fprintf(stderr, "-- return status = %d\n", result);
    }

    if (cmd != cmdBuffer && cmd != command) {
        uprv_free(cmd);
    }

    return result;
}